

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_client_write(Curl_easy *data,int type,char *buf,size_t blen)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  Curl_cwriter *pCVar3;
  
  pCVar3 = (data->req).writer_stack;
  if (pCVar3 == (Curl_cwriter *)0x0) {
    CVar2 = do_init_writer_stack(data);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pCVar3 = (data->req).writer_stack;
    if (pCVar3 == (Curl_cwriter *)0x0) {
      CVar2 = CURLE_WRITE_ERROR;
      goto LAB_0014965f;
    }
  }
  CVar2 = (*pCVar3->cwt->do_write)(data,pCVar3,type,buf,blen);
LAB_0014965f:
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
      (0 < Curl_trc_feat_write.log_level)))) {
    Curl_trc_write(data,"client_write(type=%x, len=%zu) -> %d",type,blen,(ulong)CVar2);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_client_write(struct Curl_easy *data,
                           int type, const char *buf, size_t blen)
{
  CURLcode result;

  /* it is one of those, at least */
  DEBUGASSERT(type & (CLIENTWRITE_BODY|CLIENTWRITE_HEADER|CLIENTWRITE_INFO));
  /* BODY is only BODY (with optional EOS) */
  DEBUGASSERT(!(type & CLIENTWRITE_BODY) ||
              ((type & ~(CLIENTWRITE_BODY|CLIENTWRITE_EOS)) == 0));
  /* INFO is only INFO (with optional EOS) */
  DEBUGASSERT(!(type & CLIENTWRITE_INFO) ||
              ((type & ~(CLIENTWRITE_INFO|CLIENTWRITE_EOS)) == 0));

  if(!data->req.writer_stack) {
    result = do_init_writer_stack(data);
    if(result)
      return result;
    DEBUGASSERT(data->req.writer_stack);
  }

  result = Curl_cwriter_write(data, data->req.writer_stack, type, buf, blen);
  CURL_TRC_WRITE(data, "client_write(type=%x, len=%zu) -> %d",
                 type, blen, result);
  return result;
}